

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::correctDual(HModel *this,int *freeInfeasCount)

{
  double dVar1;
  double dVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  vector<double,_std::allocator<double>_> *pvVar13;
  uint uVar14;
  double dVar15;
  
  if (this->numTot < 1) {
    iVar11 = 0;
  }
  else {
    dVar1 = this->dblOption[2];
    piVar3 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    iVar11 = 0;
    do {
      if (piVar3[lVar10] != 0) {
        dVar15 = pdVar5[lVar10];
        if ((((dVar15 != -1e+200) || (NAN(dVar15))) || (dVar2 = pdVar6[lVar10], dVar2 != 1e+200)) ||
           (NAN(dVar2))) {
          dVar2 = pdVar7[lVar10];
          if ((double)piVar4[lVar10] * dVar2 <= -dVar1) {
            if (((dVar15 == -1e+200) && (!NAN(dVar15))) ||
               ((dVar15 = pdVar6[lVar10], dVar15 == 1e+200 && (!NAN(dVar15))))) {
              this->problemPerturbed = 1;
              if (piVar4[lVar10] == 1) {
                uVar12 = (this->random).random_mw;
                uVar14 = (this->random).random_mz;
                uVar14 = (uVar14 >> 0x10) + (uVar14 & 0xffff) * 0x9069;
                (this->random).random_mz = uVar14;
                uVar12 = (uVar12 >> 0x10) + (uVar12 & 0xffff) * 18000;
                (this->random).random_mw = uVar12;
                dVar15 = ((double)(uVar14 * 0x10000 + uVar12) + 1.0) * 2.328306435454494e-10 + 1.0;
              }
              else {
                uVar12 = (this->random).random_mw;
                uVar14 = (this->random).random_mz;
                uVar14 = (uVar14 >> 0x10) + (uVar14 & 0xffff) * 0x9069;
                (this->random).random_mz = uVar14;
                uVar12 = (uVar12 >> 0x10) + (uVar12 & 0xffff) * 18000;
                (this->random).random_mw = uVar12;
                dVar15 = -(((double)(uVar14 * 0x10000 + uVar12) + 1.0) * 2.328306435454494e-10 + 1.0
                          );
              }
              pdVar7[lVar10] = dVar15 * dVar1;
              pdVar8[lVar10] = (dVar15 * dVar1 - dVar2) + pdVar8[lVar10];
            }
            else {
              pvVar13 = &this->workUpper;
              if (piVar4[lVar10] == -1) {
                pvVar13 = &this->workLower;
              }
              piVar4[lVar10] = -piVar4[lVar10];
              pdVar9[lVar10] =
                   (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
            }
          }
        }
        else {
          iVar11 = (iVar11 + 1) - (uint)(ABS(pdVar7[lVar10]) < dVar1);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numTot);
  }
  *freeInfeasCount = iVar11;
  return;
}

Assistant:

void HModel::correctDual(int *freeInfeasCount) {
  const double tau_d = dblOption[DBLOPT_DUAL_TOL];
  const double inf = HSOL_CONST_INF;
  int workCount = 0;
  for (int i = 0; i < numTot; i++) {
    if (nonbasicFlag[i]) {
      if (workLower[i] == -inf && workUpper[i] == inf) {
	// FREE variable
	workCount += (fabs(workDual[i]) >= tau_d);
      } else if (nonbasicMove[i] * workDual[i] <= -tau_d) {
	if (workLower[i] != -inf && workUpper[i] != inf) {
	  // Boxed variable = flip
	  flipBound(i);
	} else {
	  // Other variable = shift
	  problemPerturbed = 1;
	  if (nonbasicMove[i] == 1) {
	    double dual = (1 + random.dblRandom()) * tau_d;
	    double shift = dual - workDual[i];
	    workDual[i] = dual;
	    workCost[i] = workCost[i] + shift;
	  } else {
	    double dual = -(1 + random.dblRandom()) * tau_d;
	    double shift = dual - workDual[i];
	    workDual[i] = dual;
	    workCost[i] = workCost[i] + shift;
	  }
	}
      }
    }
  }
  
  *freeInfeasCount = workCount;
}